

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

void AString_trimFront(AString *str,char c)

{
  bool bVar1;
  ulong local_20;
  size_t trimCount;
  char c_local;
  AString *str_local;
  
  local_20 = 0;
  if (str != (AString *)0x0) {
    while( true ) {
      bVar1 = false;
      if (str->buffer[local_20] == c) {
        bVar1 = local_20 < str->size;
      }
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    str->size = str->size - local_20;
    if (str->size != 0) {
      memmove(str->buffer,str->buffer + local_20,str->size);
    }
    str->buffer[str->size] = '\0';
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_trimFront(struct AString *str, char c)
{
    size_t trimCount = 0;
    if(str == nullptr)
        return;
    while(str->buffer[trimCount] == c && trimCount < str->size)
        ++trimCount;
    str->size -= trimCount;
    if(str->size > 0)
        memmove(str->buffer, str->buffer + trimCount, str->size);
    str->buffer[str->size] = '\0';
}